

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Logger::~Logger(Logger *this)

{
  (this->super_Environment).super_Counted._vptr_Counted = (_func_int **)&PTR__Logger_001ad658;
  std::
  _Rb_tree<GEO::SmartPointer<GEO::LoggerClient>,_GEO::SmartPointer<GEO::LoggerClient>,_std::_Identity<GEO::SmartPointer<GEO::LoggerClient>_>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::~_Rb_tree(&(this->clients_)._M_t);
  std::__cxx11::string::~string((string *)&this->current_feature_);
  std::__cxx11::string::~string((string *)&this->log_file_name_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->log_features_exclude_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->log_features_)._M_t);
  LoggerStream::~LoggerStream(&this->status_);
  LoggerStream::~LoggerStream(&this->err_);
  LoggerStream::~LoggerStream(&this->warn_);
  LoggerStream::~LoggerStream(&this->out_);
  SystemEnvironment::~SystemEnvironment((SystemEnvironment *)this);
  return;
}

Assistant:

Logger::~Logger() {
    }